

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.h
# Opt level: O0

uint128 * __thiscall google::protobuf::uint128::operator<<=(uint128 *this,int amount)

{
  byte bVar1;
  int amount_local;
  uint128 *this_local;
  
  bVar1 = (byte)amount;
  if (amount < 0x40) {
    if (amount != 0) {
      this->hi_ = this->hi_ << (bVar1 & 0x3f) | this->lo_ >> (0x40 - bVar1 & 0x3f);
      this->lo_ = this->lo_ << (bVar1 & 0x3f);
    }
  }
  else if (amount < 0x80) {
    this->hi_ = this->lo_ << (bVar1 - 0x40 & 0x3f);
    this->lo_ = 0;
  }
  else {
    this->hi_ = 0;
    this->lo_ = 0;
  }
  return this;
}

Assistant:

inline uint128& uint128::operator<<=(int amount) {
  // uint64 shifts of >= 64 are undefined, so we will need some special-casing.
  if (amount < 64) {
    if (amount != 0) {
      hi_ = (hi_ << amount) | (lo_ >> (64 - amount));
      lo_ = lo_ << amount;
    }
  } else if (amount < 128) {
    hi_ = lo_ << (amount - 64);
    lo_ = 0;
  } else {
    hi_ = 0;
    lo_ = 0;
  }
  return *this;
}